

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

vector<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_> *
__thiscall
protozero::ScatteredHeapBuffer::GetRanges
          (vector<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
           *__return_storage_ptr__,ScatteredHeapBuffer *this)

{
  bool bVar1;
  vector<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
  *this_00;
  ContiguousMemoryRange CVar2;
  ContiguousMemoryRange local_60;
  reference local_50;
  Slice *slice;
  const_iterator __end1;
  const_iterator __begin1;
  vector<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
  *__range1;
  ScatteredHeapBuffer *this_local;
  vector<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
  *ranges;
  
  perfetto::std::
  vector<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>::
  vector(__return_storage_ptr__);
  this_00 = GetSlices(this);
  __end1 = perfetto::std::
           vector<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
           ::begin(this_00);
  slice = (Slice *)perfetto::std::
                   vector<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
                   ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_protozero::ScatteredHeapBuffer::Slice_*,_std::vector<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>_>
                                *)&slice);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_protozero::ScatteredHeapBuffer::Slice_*,_std::vector<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>_>
               ::operator*(&__end1);
    CVar2 = Slice::GetUsedRange(local_50);
    local_60 = CVar2;
    perfetto::std::
    vector<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>::
    push_back(__return_storage_ptr__,&local_60);
    __gnu_cxx::
    __normal_iterator<const_protozero::ScatteredHeapBuffer::Slice_*,_std::vector<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<protozero::ContiguousMemoryRange> ScatteredHeapBuffer::GetRanges() {
  std::vector<protozero::ContiguousMemoryRange> ranges;
  for (const auto& slice : GetSlices())
    ranges.push_back(slice.GetUsedRange());
  return ranges;
}